

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O3

gdImagePtr gdImageCreateFromTgaCtx(gdIOCtx *ctx)

{
  uint8_t uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  oTga *tga;
  gdImagePtr im;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  gdImagePtr image;
  
  tga = (oTga *)gdMalloc(0x38);
  if (tga != (oTga *)0x0) {
    tga->ident = (char *)0x0;
    tga->bitmap = (int *)0x0;
    iVar4 = read_header_tga(ctx,tga);
    if (((-1 < iVar4) && (iVar4 = read_image_tga(ctx,tga), -1 < iVar4)) &&
       (im = gdImageCreateTrueColor(tga->width,tga->height), im != (gdImagePtr)0x0)) {
      if (tga->alphabits != '\0') {
        gdImageAlphaBlending(im,0);
        gdImageSaveAlpha(im,1);
      }
      iVar4 = tga->height;
      if (0 < iVar4) {
        iVar8 = tga->width;
        lVar5 = 0;
        iVar6 = 0;
        do {
          if (0 < iVar8) {
            piVar2 = im->tpixels[lVar5];
            uVar1 = tga->bits;
            lVar7 = 0;
            do {
              if (uVar1 == ' ') {
                if (tga->alphabits != '\0') {
                  piVar3 = tga->bitmap;
                  iVar4 = piVar3[(long)iVar6 + 1] * 0x100 +
                          piVar3[(long)iVar6 + 2] * 0x10000 +
                          (piVar3[(long)iVar6 + 3] & 0xfffffffeU) * -0x800000 + piVar3[iVar6] +
                          0x7f000000;
                  iVar8 = 4;
                  goto LAB_0011f3c5;
                }
              }
              else if (uVar1 == '\x18') {
                piVar3 = tga->bitmap;
                iVar4 = piVar3[(long)iVar6 + 1] * 0x100 + piVar3[(long)iVar6 + 2] * 0x10000 +
                        piVar3[iVar6];
                iVar8 = 3;
LAB_0011f3c5:
                piVar2[lVar7] = iVar4;
                iVar6 = iVar6 + iVar8;
              }
              iVar8 = tga->width;
              lVar7 = lVar7 + 1;
            } while ((int)lVar7 < iVar8);
            iVar4 = tga->height;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar4);
      }
      if (tga->flipv == '\0') {
        if (tga->fliph != '\0') {
          gdImageFlipHorizontal(im);
        }
      }
      else if (tga->fliph == '\0') {
        gdImageFlipVertical(im);
      }
      else {
        gdImageFlipBoth(im);
      }
      free_tga(tga);
      return im;
    }
    free_tga(tga);
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromTgaCtx(gdIOCtx* ctx)
{
	int bitmap_caret = 0;
	oTga *tga = NULL;
	/*	int pixel_block_size = 0;
		int image_block_size = 0; */
	volatile gdImagePtr image = NULL;
	int x = 0;
	int y = 0;

	tga = (oTga *) gdMalloc(sizeof(oTga));
	if (!tga) {
		return NULL;
	}

	tga->bitmap = NULL;
	tga->ident = NULL;

	if (read_header_tga(ctx, tga) < 0) {
		free_tga(tga);
		return NULL;
	}

	/*TODO: Will this be used?
		pixel_block_size = tga->bits / 8;
		image_block_size = (tga->width * tga->height) * pixel_block_size;
	*/

	if (read_image_tga(ctx, tga) < 0) {
		free_tga(tga);
		return NULL;
	}

	image = gdImageCreateTrueColor((int)tga->width, (int)tga->height );

	if (image == 0) {
		free_tga( tga );
		return NULL;
	}

	/*!	\brief Populate GD image object
	 *  Copy the pixel data from our tga bitmap buffer into the GD image
	 *  Disable blending and save the alpha channel per default
	 */
	if (tga->alphabits) {
		gdImageAlphaBlending(image, 0);
		gdImageSaveAlpha(image, 1);
	}

	/* TODO: use alphabits as soon as we support 24bit and other alpha bps (ie != 8bits) */
	for (y = 0; y < tga->height; y++) {
		register int *tpix = image->tpixels[y];
		for ( x = 0; x < tga->width; x++, tpix++) {
			if (tga->bits == TGA_BPP_24) {
				*tpix = gdTrueColor(tga->bitmap[bitmap_caret + 2], tga->bitmap[bitmap_caret + 1], tga->bitmap[bitmap_caret]);
				bitmap_caret += 3;
			} else if (tga->bits == TGA_BPP_32 && tga->alphabits) {
				register int a = tga->bitmap[bitmap_caret + 3];

				*tpix = gdTrueColorAlpha(tga->bitmap[bitmap_caret + 2], tga->bitmap[bitmap_caret + 1], tga->bitmap[bitmap_caret], gdAlphaMax - (a >> 1));
				bitmap_caret += 4;
			}
		}
	}

	if (tga->flipv && tga->fliph) {
		gdImageFlipBoth(image);
	} else if (tga->flipv) {
		gdImageFlipVertical(image);
	} else if (tga->fliph) {
		gdImageFlipHorizontal(image);
	}

	free_tga(tga);

	return image;
}